

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

Tree * jhu::thrax::readTree(Tree *__return_storage_ptr__,string_view line)

{
  pointer pNVar1;
  IndexType IVar2;
  pointer pbVar3;
  invalid_argument *piVar4;
  char *in_RCX;
  char *pcVar5;
  thrax *this;
  size_type __n;
  Node *this_00;
  long lVar6;
  size_t sVar7;
  string_view line_00;
  Sentence tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Sentence local_48;
  
  line_00._M_len = line._M_str;
  this = (thrax *)line._M_len;
  line_00._M_str = in_RCX;
  split(&local_48,this,line_00);
  __n = 0;
  for (pbVar3 = local_48.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != local_48.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    __n = __n + (*pbVar3->_M_str == '(');
  }
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_68);
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = 0;
    this_00 = (Node *)0x0;
    pbVar3 = local_48.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar7 = pbVar3->_M_len;
      pcVar5 = pbVar3->_M_str;
      if (*pcVar5 == '(') {
        if (this_00 == (Node *)0x0) {
          IVar2 = 0;
        }
        else {
          IVar2 = (this_00->span).end;
        }
        pcVar5 = pcVar5 + 1;
        sVar7 = sVar7 - 1;
        pNVar1 = (__return_storage_ptr__->
                 super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar1[lVar6].span.start = IVar2;
        pNVar1[lVar6].span.end = IVar2;
        pNVar1[lVar6].label._M_len = sVar7;
        pNVar1[lVar6].label._M_str = pcVar5;
        pNVar1[lVar6].parent = this_00;
        this_00 = (__return_storage_ptr__->
                  super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar6;
        lVar6 = lVar6 + 1;
      }
      else {
        if (this_00 == (Node *)0x0) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,line_00._M_len,this + (long)line_00._M_len);
          std::operator+(&local_68,"bad tree: ",&local_88);
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_68);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        Node::add_suffix(this_00);
      }
      for (; (sVar7 != 0 && (pcVar5[sVar7 - 1] == ')')); sVar7 = sVar7 - 1) {
        if (this_00 == (pointer)0x0) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,line_00._M_len,this + (long)line_00._M_len);
          std::operator+(&local_68,"bad tree: ",&local_88);
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_68);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        this_00 = this_00->parent;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != local_48.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (this_00 != (pointer)0x0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,line_00._M_len,this + (long)line_00._M_len);
      std::operator+(&local_68,"bad tree: ",&local_88);
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_68);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Tree readTree(std::string_view line) {
  auto tokens = split(line);
  auto nodeCount = std::count_if(
      tokens.begin(), tokens.end(), [](auto t) { return t.front() == '('; });
  Tree result(nodeCount);
  size_t nextNodeIndex = 0;
  Node* curr = nullptr;
  for (auto t : tokens) {
    if (t.front() == '(') {
      IndexType start = curr == nullptr ? 0 : curr->span.end;
      t.remove_prefix(1);
      result[nextNodeIndex] = Node{ { start, start }, t, curr };
      curr = &result[nextNodeIndex++];
    } else {
      if (curr == nullptr) {
        throw std::invalid_argument("bad tree: " + std::string(line));
      }
      curr->add_suffix();
    }
    while (!t.empty() && t.back() == ')') {
      if (curr == nullptr) {
        throw std::invalid_argument("bad tree: " + std::string(line));
      }
      curr = curr->parent;
      t.remove_suffix(1);
    }
  }
  if (curr != nullptr) {
    // Not enough close parens
    throw std::invalid_argument("bad tree: " + std::string(line));
  }
  return result;
}